

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O2

void ScanLine(int x1,int y1,int x2,int y2,int ymax,vector<int,_std::allocator<int>_> *xrange)

{
  pointer piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  
  uVar8 = x2 - x1;
  uVar6 = y2 - y1;
  iVar5 = (int)uVar8 >> 0x1f;
  if (0 < (int)uVar8) {
    iVar5 = 1;
  }
  iVar2 = (int)uVar6 >> 0x1f;
  if (0 < (int)uVar6) {
    iVar2 = 1;
  }
  uVar12 = -uVar8;
  if (0 < (int)uVar8) {
    uVar12 = uVar8;
  }
  uVar8 = -uVar6;
  if (0 < (int)uVar6) {
    uVar8 = uVar6;
  }
  if (uVar12 < uVar8) {
    iVar9 = 0;
    uVar6 = uVar8;
    uVar8 = uVar12;
    iVar10 = iVar2;
  }
  else {
    iVar10 = 0;
    iVar9 = iVar5;
    uVar6 = uVar12;
  }
  iVar11 = uVar6 + 1;
  uVar12 = uVar8 >> 1;
  piVar1 = (xrange->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
    if (y1 < ymax && -1 < y1) {
      uVar7 = y1 * 2;
      if (x1 < piVar1[uVar7]) {
        piVar1[uVar7] = x1;
      }
      if (piVar1[uVar7 | 1] < x1) {
        piVar1[uVar7 | 1] = x1;
      }
    }
    uVar7 = uVar6;
    iVar3 = iVar5;
    iVar4 = iVar2;
    if ((int)(uVar12 + uVar8) < (int)uVar6) {
      uVar7 = 0;
      iVar3 = iVar9;
      iVar4 = iVar10;
    }
    uVar12 = (uVar12 + uVar8) - uVar7;
    y1 = y1 + iVar4;
    x1 = x1 + iVar3;
  }
  return;
}

Assistant:

void ScanLine(int x1, int y1, int x2, int y2, int ymax, std::vector<int> & xrange) {
    int sx, sy, dx1, dy1, dx2, dy2, x, y, m, n, k, cnt;

    sx = x2 - x1;
    sy = y2 - y1;

    if (sx > 0) dx1 = 1;
    else if (sx < 0) dx1 = -1;
    else dx1 = 0;

    if (sy > 0) dy1 = 1;
    else if (sy < 0) dy1 = -1;
    else dy1 = 0;

    m = ABS(sx);
    n = ABS(sy);
    dx2 = dx1;
    dy2 = 0;

    if (m < n)
    {
        m = ABS(sy);
        n = ABS(sx);
        dx2 = 0;
        dy2 = dy1;
    }

    x = x1; y = y1;
    cnt = m + 1;
    k = n / 2;

    while (cnt--) {
        if ((y >= 0) && (y < ymax)) {
            if (x < xrange[2*y+0]) xrange[2*y+0] = x;
            if (x > xrange[2*y+1]) xrange[2*y+1] = x;
        }

        k += n;
        if (k < m) {
            x += dx2;
            y += dy2;
        } else {
            k -= m;
            x += dx1;
            y += dy1;
        }
    }
}